

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall
Jupiter::Timer::Timer
          (Timer *this,uint in_iterations,milliseconds in_delay,FunctionType in_function,
          void *in_parameters,bool in_immediate)

{
  long lVar1;
  _List_node_base *p_Var2;
  undefined3 in_register_00000089;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_00147ae8;
  (this->m_next_call).__d.__r = 0;
  this->m_function = in_function;
  this->m_parameters = in_parameters;
  this->m_iterations = in_iterations;
  (this->m_delay).__r = in_delay.__r;
  lVar1 = std::chrono::_V2::steady_clock::now();
  (this->m_next_call).__d.__r = lVar1;
  if (CONCAT31(in_register_00000089,in_immediate) == 0) {
    (this->m_next_call).__d.__r = (this->m_delay).__r * 1000000 + lVar1;
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  o_timers_abi_cxx11_.super__List_base<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>._M_impl.
  _M_node._M_size =
       o_timers_abi_cxx11_.super__List_base<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>.
       _M_impl._M_node._M_size + 1;
  return;
}

Assistant:

Jupiter::Timer::Timer(unsigned int in_iterations, std::chrono::milliseconds in_delay, FunctionType in_function, void *in_parameters, bool in_immediate)
{
	m_function = in_function;
	m_parameters = in_parameters;
	m_iterations = in_iterations;
	m_delay = in_delay;
	m_next_call = std::chrono::steady_clock::now();

	if (in_immediate == false)
		m_next_call += m_delay;

	o_timers.push_back(this);
}